

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_3::DBIter::Next(DBIter *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  ulong extraout_RDX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->valid_ == false) {
    __assert_fail("valid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_iter.cc"
                  ,0x8e,"virtual void leveldb::(anonymous namespace)::DBIter::Next()");
  }
  if (this->direction_ == kReverse) {
    this->direction_ = kForward;
    iVar2 = (*this->iter_->_vptr_Iterator[2])();
    lVar3 = 0x18;
    if ((char)iVar2 != '\0') {
      lVar3 = 0x30;
    }
    (**(code **)((long)this->iter_->_vptr_Iterator + lVar3))();
  }
  else {
    iVar2 = (*this->iter_->_vptr_Iterator[8])();
    if (extraout_RDX < 8) {
      __assert_fail("internal_key.size() >= 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/dbformat.h"
                    ,0x60,"Slice leveldb::ExtractUserKey(const Slice &)");
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&this->saved_key_,0,(this->saved_key_)._M_string_length,
               (char *)CONCAT44(extraout_var,iVar2),extraout_RDX - 8);
    (*this->iter_->_vptr_Iterator[6])();
  }
  iVar2 = (*this->iter_->_vptr_Iterator[2])();
  if ((char)iVar2 == '\0') {
    this->valid_ = false;
    (this->saved_key_)._M_string_length = 0;
    *(this->saved_key_)._M_dataplus._M_p = '\0';
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    FindNextUserEntry(this,true,&this->saved_key_);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBIter::Next() {
  assert(valid_);

  if (direction_ == kReverse) {  // Switch directions?
    direction_ = kForward;
    // iter_ is pointing just before the entries for this->key(),
    // so advance into the range of entries for this->key() and then
    // use the normal skipping code below.
    if (!iter_->Valid()) {
      iter_->SeekToFirst();
    } else {
      iter_->Next();
    }
    if (!iter_->Valid()) {
      valid_ = false;
      saved_key_.clear();
      return;
    }
    // saved_key_ already contains the key to skip past.
  } else {
    // Store in saved_key_ the current key so we skip it below.
    SaveKey(ExtractUserKey(iter_->key()), &saved_key_);

    // iter_ is pointing to current key. We can now safely move to the next to
    // avoid checking current key.
    iter_->Next();
    if (!iter_->Valid()) {
      valid_ = false;
      saved_key_.clear();
      return;
    }
  }

  FindNextUserEntry(true, &saved_key_);
}